

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
Address_SegwitAddressFromStringTest_Test::TestBody(Address_SegwitAddressFromStringTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_ed8;
  Message local_ed0 [2];
  CfdException *anon_var_0;
  string local_eb8;
  Address local_e98;
  byte local_d19;
  char *pcStack_d18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_d08;
  SchnorrPubkey local_d00;
  string local_ce8;
  undefined1 local_cc8 [8];
  AssertionResult gtest_ar_20;
  Message local_cb0;
  ByteData local_ca8;
  string local_c90;
  undefined1 local_c70 [8];
  AssertionResult gtest_ar_19;
  Message local_c58;
  WitnessVersion local_c50 [2];
  undefined1 local_c48 [8];
  AssertionResult gtest_ar_18;
  Message local_c30;
  AddressType local_c28 [2];
  undefined1 local_c20 [8];
  AssertionResult gtest_ar_17;
  Message local_c08;
  NetType local_c00 [2];
  undefined1 local_bf8 [8];
  AssertionResult gtest_ar_16;
  Message local_be0;
  string local_bd8;
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar_15;
  Message local_ba0;
  allocator local_b91;
  string local_b90;
  Address local_b70;
  AssertHelper local_9f8;
  Message local_9f0;
  WitnessVersion local_9e8 [2];
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar_14;
  Message local_9c8;
  AddressType local_9c0 [2];
  undefined1 local_9b8 [8];
  AssertionResult gtest_ar_13;
  Message local_9a0;
  NetType local_998 [2];
  undefined1 local_990 [8];
  AssertionResult gtest_ar_12;
  Message local_978;
  string local_970;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_11;
  Message local_938;
  allocator local_929;
  string local_928;
  Address local_908;
  AssertHelper local_790;
  Message local_788;
  WitnessVersion local_780 [2];
  undefined1 local_778 [8];
  AssertionResult gtest_ar_10;
  Message local_760;
  AddressType local_758 [2];
  undefined1 local_750 [8];
  AssertionResult gtest_ar_9;
  Message local_738;
  NetType local_730 [2];
  undefined1 local_728 [8];
  AssertionResult gtest_ar_8;
  Message local_710;
  string local_708;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar_7;
  Message local_6d0;
  allocator local_6c1;
  string local_6c0;
  Address local_6a0;
  AssertHelper local_528;
  Message local_520;
  Script local_518;
  string local_4e0;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_6;
  Message local_4a8;
  Pubkey local_4a0;
  string local_488;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_5;
  Message local_450;
  ByteData local_448;
  string local_430;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_4;
  Message local_3f8;
  WitnessVersion local_3f0 [2];
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_3;
  Message local_3d0;
  AddressType local_3c8 [2];
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_2;
  Message local_3a8;
  NetType local_3a0 [2];
  undefined1 local_398 [8];
  AssertionResult gtest_ar_1;
  Message local_380;
  string local_378;
  undefined1 local_358 [8];
  AssertionResult gtest_ar;
  Message local_340;
  allocator local_331;
  string local_330;
  Address local_310;
  undefined1 local_188 [8];
  Address address;
  Address_SegwitAddressFromStringTest_Test *this_local;
  
  address.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  cfd::core::Address::Address((Address *)local_188);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_330,"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",&local_331);
      cfd::core::Address::Address(&local_310,&local_330);
      cfd::core::Address::operator=((Address *)local_188,&local_310);
      cfd::core::Address::~Address(&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
    }
  }
  else {
    testing::Message::Message(&local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1aa,
               "Expected: (address = Address(\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_340);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_378,(Address *)local_188);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_358,"\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",
             "address.GetAddress().c_str()","bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",pcVar2);
  std::__cxx11::string::~string((string *)&local_378);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  local_3a0[1] = 0;
  local_3a0[0] = cfd::core::Address::GetNetType((Address *)local_188);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_398,"NetType::kMainnet","address.GetNetType()",local_3a0 + 1,
             local_3a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  local_3c8[1] = 4;
  local_3c8[0] = cfd::core::Address::GetAddressType((Address *)local_188);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_3c0,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             local_3c8 + 1,local_3c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  local_3f0[1] = 0;
  local_3f0[0] = cfd::core::Address::GetWitnessVersion((Address *)local_188);
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((EqHelper<false> *)local_3e8,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             local_3f0 + 1,local_3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1af,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  cfd::core::Address::GetHash(&local_448,(Address *)local_188);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_430,&local_448);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_410,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",pcVar2)
  ;
  std::__cxx11::string::~string((string *)&local_430);
  cfd::core::ByteData::~ByteData(&local_448);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  cfd::core::Address::GetPubkey(&local_4a0,(Address *)local_188);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_488,&local_4a0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_468,"\"\"","address.GetPubkey().GetHex().c_str()","",pcVar2);
  std::__cxx11::string::~string((string *)&local_488);
  cfd::core::Pubkey::~Pubkey(&local_4a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  cfd::core::Address::GetScript(&local_518,(Address *)local_188);
  cfd::core::Script::GetHex_abi_cxx11_(&local_4e0,&local_518);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4c0,"\"\"","address.GetScript().GetHex().c_str()","",pcVar2);
  std::__cxx11::string::~string((string *)&local_4e0);
  cfd::core::Script::~Script(&local_518);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_528,&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_528);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_6c0,
                 "tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",&local_6c1);
      cfd::core::Address::Address(&local_6a0,&local_6c0);
      cfd::core::Address::operator=((Address *)local_188,&local_6a0);
      cfd::core::Address::~Address(&local_6a0);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
    }
  }
  else {
    testing::Message::Message(&local_6d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b5,
               "Expected: (address = Address(\"tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_6d0);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_708,(Address *)local_188);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6e8,
             "\"tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt\"",
             "address.GetAddress().c_str()",
             "tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",pcVar2);
  std::__cxx11::string::~string((string *)&local_708);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
  if (!bVar1) {
    testing::Message::Message(&local_710);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_710);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
  local_730[1] = 1;
  local_730[0] = cfd::core::Address::GetNetType((Address *)local_188);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_728,"NetType::kTestnet","address.GetNetType()",local_730 + 1,
             local_730);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_728);
  if (!bVar1) {
    testing::Message::Message(&local_738);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_728);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
  local_758[1] = 3;
  local_758[0] = cfd::core::Address::GetAddressType((Address *)local_188);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_750,"AddressType::kP2wshAddress","address.GetAddressType()",
             local_758 + 1,local_758);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
  if (!bVar1) {
    testing::Message::Message(&local_760);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_750);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_760);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
  local_780[1] = 0;
  local_780[0] = cfd::core::Address::GetWitnessVersion((Address *)local_188);
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((EqHelper<false> *)local_778,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             local_780 + 1,local_780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
  if (!bVar1) {
    testing::Message::Message(&local_788);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ba,pcVar2);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    testing::Message::~Message(&local_788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_928,"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",&local_929);
      cfd::core::Address::Address(&local_908,&local_928);
      cfd::core::Address::operator=((Address *)local_188,&local_908);
      cfd::core::Address::~Address(&local_908);
      std::__cxx11::string::~string((string *)&local_928);
      std::allocator<char>::~allocator((allocator<char> *)&local_929);
    }
  }
  else {
    testing::Message::Message(&local_938);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1bc,
               "Expected: (address = Address(\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_938);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_970,(Address *)local_188);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_950,"\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6\"",
             "address.GetAddress().c_str()","bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",pcVar2);
  std::__cxx11::string::~string((string *)&local_970);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1be,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  local_998[1] = 2;
  local_998[0] = cfd::core::Address::GetNetType((Address *)local_188);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_990,"NetType::kRegtest","address.GetNetType()",local_998 + 1,
             local_998);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar1) {
    testing::Message::Message(&local_9a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_990);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1bf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_9a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_9a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  local_9c0[1] = 4;
  local_9c0[0] = cfd::core::Address::GetAddressType((Address *)local_188);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_9b8,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             local_9c0 + 1,local_9c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b8);
  if (!bVar1) {
    testing::Message::Message(&local_9c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_9c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_9c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b8);
  local_9e8[1] = 0;
  local_9e8[0] = cfd::core::Address::GetWitnessVersion((Address *)local_188);
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((EqHelper<false> *)local_9e0,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             local_9e8 + 1,local_9e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
  if (!bVar1) {
    testing::Message::Message(&local_9f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_9f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9f8,&local_9f0);
    testing::internal::AssertHelper::~AssertHelper(&local_9f8);
    testing::Message::~Message(&local_9f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b90,
                 "bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",&local_b91);
      cfd::core::Address::Address(&local_b70,&local_b90);
      cfd::core::Address::operator=((Address *)local_188,&local_b70);
      cfd::core::Address::~Address(&local_b70);
      std::__cxx11::string::~string((string *)&local_b90);
      std::allocator<char>::~allocator((allocator<char> *)&local_b91);
    }
  }
  else {
    testing::Message::Message(&local_ba0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c3,
               "Expected: (address = Address(\"bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_ba0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_ba0);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_bd8,(Address *)local_188);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_bb8,
             "\"bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq\"",
             "address.GetAddress().c_str()",
             "bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",pcVar2);
  std::__cxx11::string::~string((string *)&local_bd8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
  if (!bVar1) {
    testing::Message::Message(&local_be0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_be0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_be0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
  local_c00[1] = 2;
  local_c00[0] = cfd::core::Address::GetNetType((Address *)local_188);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_bf8,"NetType::kRegtest","address.GetNetType()",local_c00 + 1,
             local_c00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf8);
  if (!bVar1) {
    testing::Message::Message(&local_c08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bf8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_c08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_c08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf8);
  local_c28[1] = 7;
  local_c28[0] = cfd::core::Address::GetAddressType((Address *)local_188);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_c20,"AddressType::kTaprootAddress","address.GetAddressType()",
             local_c28 + 1,local_c28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c20);
  if (!bVar1) {
    testing::Message::Message(&local_c30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_c30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_c30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c20);
  local_c50[1] = 1;
  local_c50[0] = cfd::core::Address::GetWitnessVersion((Address *)local_188);
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((EqHelper<false> *)local_c48,"WitnessVersion::kVersion1","address.GetWitnessVersion()",
             local_c50 + 1,local_c50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c48);
  if (!bVar1) {
    testing::Message::Message(&local_c58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_c58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c48);
  cfd::core::Address::GetHash(&local_ca8,(Address *)local_188);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_c90,&local_ca8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c70,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "address.GetHash().GetHex().c_str()",
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",pcVar2);
  std::__cxx11::string::~string((string *)&local_c90);
  cfd::core::ByteData::~ByteData(&local_ca8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c70);
  if (!bVar1) {
    testing::Message::Message(&local_cb0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ca,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_cb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_cb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c70);
  cfd::core::Address::GetSchnorrPubkey(&local_d00,(Address *)local_188);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_ce8,&local_d00);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_cc8,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "address.GetSchnorrPubkey().GetHex().c_str()",
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",pcVar2);
  std::__cxx11::string::~string((string *)&local_ce8);
  cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_d00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc8);
  if (!bVar1) {
    testing::Message::Message(&local_d08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1cc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_d08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_d08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff2e8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff2e8);
  if (bVar1) {
    local_d19 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_eb8,"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6",
                 (allocator *)((long)&anon_var_0 + 7));
      cfd::core::Address::Address(&local_e98,&local_eb8);
      cfd::core::Address::operator=((Address *)local_188,&local_e98);
      cfd::core::Address::~Address(&local_e98);
      std::__cxx11::string::~string((string *)&local_eb8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    if ((local_d19 & 1) != 0) goto LAB_003963cc;
    pcStack_d18 = 
    "Expected: (address = Address(\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_ed0);
  testing::internal::AssertHelper::AssertHelper
            (&local_ed8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
             ,0x1d0,pcStack_d18);
  testing::internal::AssertHelper::operator=(&local_ed8,local_ed0);
  testing::internal::AssertHelper::~AssertHelper(&local_ed8);
  testing::Message::~Message(local_ed0);
LAB_003963cc:
  cfd::core::Address::~Address((Address *)local_188);
  return;
}

Assistant:

TEST(Address, SegwitAddressFromStringTest) {
  Address address;
  EXPECT_NO_THROW((address = Address("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q")));
  EXPECT_STREQ("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address("tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt")));
  EXPECT_STREQ("tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wshAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());

  EXPECT_NO_THROW((address = Address("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6")));
  EXPECT_STREQ("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());

  EXPECT_NO_THROW((address = Address("bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq")));
  EXPECT_STREQ("bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  EXPECT_EQ(AddressType::kTaprootAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion1, address.GetWitnessVersion());
  EXPECT_STREQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
              address.GetHash().GetHex().c_str());
  EXPECT_STREQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
              address.GetSchnorrPubkey().GetHex().c_str());

  // Illegal data
  EXPECT_THROW((address = Address("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6")),
               CfdException);
}